

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

size_t coda_revxspn(char *s,char *n,size_t len)

{
  char cVar1;
  long lVar2;
  __int32_t **pp_Var3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  
  lVar4 = len - 1;
  pcVar5 = n;
  lVar7 = lVar4;
  lVar2 = -1;
  if (lVar4 < -1) {
    lVar2 = lVar4;
  }
  while ((lVar8 = lVar2, -1 < lVar7 && (pcVar6 = n, lVar8 = lVar7, *pcVar5 != '\0'))) {
    while ((cVar1 = *pcVar6, (long)cVar1 != 0 &&
           (pp_Var3 = __ctype_tolower_loc(), (*pp_Var3)[s[lVar7]] != (*pp_Var3)[cVar1]))) {
      pcVar6 = pcVar6 + 1;
    }
    pcVar5 = pcVar6;
    lVar7 = lVar7 + -1;
  }
  return lVar4 - lVar8;
}

Assistant:

size_t coda_revxspn(const char *s, const char *n, size_t len)
{
	const char *b = s - 1;
	const char *p = s - 1 + len;
	const char *x = n;

	for (; p > b && *x; --p)
	{
		for (x = n; *x; ++x)
		{
			if (tolower(*p) == tolower(*x)) break;
		}
	}

	return s - 1 + len - p;
}